

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

value class_static_await(klass cls,method m,void **args,size_t size,
                        class_resolve_callback resolve_callback,
                        class_reject_callback reject_callback,void *context)

{
  class_interface pcVar1;
  char *pcVar2;
  value pvVar3;
  char *pcVar4;
  
  if ((cls == (klass)0x0) || (pcVar1 = cls->interface, pcVar1 == (class_interface)0x0)) {
    pvVar3 = (value)0x0;
  }
  else {
    pvVar3 = (value)0x0;
    if ((m != (method)0x0) && (pcVar1->static_invoke != (class_impl_interface_static_invoke)0x0)) {
      pvVar3 = (*pcVar1->static_await)
                         (cls,cls->impl,m,args,size,resolve_callback,reject_callback,context);
      if (pvVar3 == (value)0x0) {
        pcVar2 = cls->name;
        pcVar4 = method_name(m);
        pvVar3 = (value)0x0;
        log_write_impl_va("metacall",0x30e,"class_static_await",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                          ,LOG_LEVEL_ERROR,"Invalid class %s await of method %s",pcVar2,pcVar4);
      }
    }
  }
  return pvVar3;
}

Assistant:

value class_static_await(klass cls, method m, class_args args, size_t size, class_resolve_callback resolve_callback, class_reject_callback reject_callback, void *context)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_invoke != NULL && m != NULL)
	{
		value v = cls->interface->static_await(cls, cls->impl, m, args, size, resolve_callback, reject_callback, context);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s await of method %s", cls->name, method_name(m));

			return NULL;
		}

		return v;
	}

	return NULL;
}